

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

double __thiscall despot::Parser::GetReward(Parser *this,ACT_TYPE action)

{
  ulong uVar1;
  pointer pFVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  pFVar2 = (this->reward_funcs_).
           super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->reward_funcs_).super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
      _M_impl.super__Vector_impl_data._M_finish == pFVar2) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    lVar4 = 0;
    uVar3 = 0;
    do {
      dVar6 = (double)(**(code **)(*(long *)((long)&pFVar2->_vptr_Function + lVar4) + 0x28))
                                ((long)&pFVar2->_vptr_Function + lVar4,0);
      dVar5 = dVar5 + dVar6;
      uVar3 = uVar3 + 1;
      pFVar2 = (this->reward_funcs_).
               super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = ((long)(this->reward_funcs_).
                     super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)pFVar2 >> 3) * 0x2e8ba2e8ba2e8ba3;
      lVar4 = lVar4 + 0x58;
    } while (uVar3 <= uVar1 && uVar1 - uVar3 != 0);
  }
  return dVar5;
}

Assistant:

double Parser::GetReward(ACT_TYPE action) const {
	action_vars_[0].curr_value = action;

	double reward = 0;
	for (int r = 0; r < reward_funcs_.size(); r++)
		reward += reward_funcs_[r].GetValue();
	return reward;
}